

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureUnitTests::init(TextureUnitTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Context *pCVar2;
  uint uVar3;
  long *plVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long *extraout_RAX;
  long *plVar7;
  char *name;
  uint uVar8;
  long lVar9;
  string countGroupName;
  int local_208;
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  TestNode *local_1c0;
  long local_1b8;
  TestNode *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar9 = 0;
  do {
    iVar1 = init::unitCounts[lVar9];
    if (lVar9 == 3) {
      local_200[0] = local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"all","");
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    plVar4 = (long *)std::__cxx11::string::append((char *)local_200);
    local_1e0 = &local_1d0;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_1d0 = *plVar7;
      lStack_1c8 = plVar4[3];
    }
    else {
      local_1d0 = *plVar7;
      local_1e0 = (long *)*plVar4;
    }
    local_1d8 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_200[0] != local_1f0) {
      operator_delete(local_200[0],local_1f0[0] + 1);
    }
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               (char *)local_1e0,"");
    tcu::TestNode::addChild((TestNode *)this,pTVar5);
    local_208 = 0;
    local_1c0 = pTVar5;
    local_1b8 = lVar9;
    do {
      pTVar5 = local_1c0;
      pTVar6 = (TestNode *)operator_new(0x70);
      name = "mixed";
      if (local_208 == 1) {
        name = "only_cube";
      }
      if (local_208 == 0) {
        name = "only_2d";
      }
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,name,"");
      tcu::TestNode::addChild(pTVar5,pTVar6);
      uVar8 = 0;
      local_1b0 = pTVar6;
      do {
        pTVar6 = (TestNode *)operator_new(0x128);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::ostream::operator<<(local_1a8,uVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,pCVar2->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_200[0],
                   "");
        pTVar5 = local_1b0;
        uVar3 = (uVar8 ^ 0x3d) * 9;
        uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
        pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__TextureUnitCase_00776930;
        *(int *)&pTVar6[1].m_testCtx = iVar1;
        *(int *)((long)&pTVar6[1].m_testCtx + 4) = local_208;
        *(uint *)&pTVar6[1].m_name._M_dataplus._M_p = uVar3 >> 0xf ^ uVar3;
        memset(&pTVar6[1].m_name.field_2,0,0x98);
        tcu::TestNode::addChild(pTVar5,pTVar6);
        if (local_200[0] != local_1f0) {
          operator_delete(local_200[0],local_1f0[0] + 1);
        }
        lVar9 = local_1b8;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 10);
      local_208 = local_208 + 1;
    } while (local_208 != 3);
    plVar4 = &local_1d0;
    if (local_1e0 != plVar4) {
      operator_delete(local_1e0,local_1d0 + 1);
      plVar4 = extraout_RAX;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  return (int)plVar4;
}

Assistant:

void TextureUnitTests::init (void)
{
	const int numTestsPerGroup = 10;

	static const int unitCounts[] =
	{
		2,
		4,
		8,
		-1 // \note Negative stands for the implementation-specified maximum.
	};

	for (int unitCountNdx = 0; unitCountNdx < DE_LENGTH_OF_ARRAY(unitCounts); unitCountNdx++)
	{
		int numUnits = unitCounts[unitCountNdx];

		string countGroupName = (unitCounts[unitCountNdx] < 0 ? "all" : de::toString(numUnits)) + "_units";

		tcu::TestCaseGroup* countGroup = new tcu::TestCaseGroup(m_testCtx, countGroupName.c_str(), "");
		addChild(countGroup);

		DE_STATIC_ASSERT((int)TextureUnitCase::CASE_ONLY_2D == 0);

		for (int caseType = (int)TextureUnitCase::CASE_ONLY_2D; caseType < (int)TextureUnitCase::CASE_LAST; caseType++)
		{
			const char* caseTypeGroupName = (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D	? "only_2d" :
											(TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_CUBE	? "only_cube" :
											(TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_MIXED		? "mixed" :
																													  DE_NULL;
			DE_ASSERT(caseTypeGroupName != DE_NULL);

			tcu::TestCaseGroup* caseTypeGroup = new tcu::TestCaseGroup(m_testCtx, caseTypeGroupName, "");
			countGroup->addChild(caseTypeGroup);

			for (int testNdx = 0; testNdx < numTestsPerGroup; testNdx++)
				caseTypeGroup->addChild(new TextureUnitCase(m_context, de::toString(testNdx).c_str(), "", numUnits, (TextureUnitCase::CaseType)caseType, (deUint32)deInt32Hash(testNdx)));
		}
	}
}